

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor0.c
# Opt level: O2

void floor0_free_look(vorbis_look_floor *i)

{
  vorbis_look_floor0 *look;
  
  if (i != (vorbis_look_floor *)0x0) {
    free(*(void **)((long)i + 0x10));
    free(*(void **)((long)i + 0x20));
    free(i);
    return;
  }
  return;
}

Assistant:

static void floor0_free_look(vorbis_look_floor *i){
  vorbis_look_floor0 *look=(vorbis_look_floor0 *)i;
  if(look){

    if(look->linearmap)_ogg_free(look->linearmap);
    if(look->lsp_look)_ogg_free(look->lsp_look);
    memset(look,0,sizeof(*look));
    _ogg_free(look);
  }
}